

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t aom_get_sse_plane(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b,int plane,int highbd)

{
  uint in_ECX;
  int in_EDX;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined8 local_8;
  
  if (in_ECX == 0) {
    if (in_EDX == 0) {
      local_8 = aom_get_y_sse((YV12_BUFFER_CONFIG *)0x0,
                              (YV12_BUFFER_CONFIG *)((ulong)in_stack_ffffffffffffffdc << 0x20));
    }
    else if (in_EDX == 1) {
      local_8 = aom_get_u_sse((YV12_BUFFER_CONFIG *)0x100000000,
                              (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffdc,1));
    }
    else if (in_EDX == 2) {
      local_8 = aom_get_v_sse((YV12_BUFFER_CONFIG *)0x200000000,
                              (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffdc,2));
    }
    else {
      local_8 = 0;
    }
  }
  else if (in_EDX == 0) {
    local_8 = aom_highbd_get_y_sse
                        ((YV12_BUFFER_CONFIG *)(ulong)in_ECX,
                         (YV12_BUFFER_CONFIG *)(ulong)in_stack_ffffffffffffffd8);
  }
  else if (in_EDX == 1) {
    local_8 = aom_highbd_get_u_sse
                        ((YV12_BUFFER_CONFIG *)CONCAT44(1,in_ECX),
                         (YV12_BUFFER_CONFIG *)CONCAT44(1,in_stack_ffffffffffffffd8));
  }
  else if (in_EDX == 2) {
    local_8 = aom_highbd_get_v_sse
                        ((YV12_BUFFER_CONFIG *)CONCAT44(2,in_ECX),
                         (YV12_BUFFER_CONFIG *)CONCAT44(2,in_stack_ffffffffffffffd8));
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

int64_t aom_get_sse_plane(const YV12_BUFFER_CONFIG *a,
                          const YV12_BUFFER_CONFIG *b, int plane, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    switch (plane) {
      case 0: return aom_highbd_get_y_sse(a, b);
      case 1: return aom_highbd_get_u_sse(a, b);
      case 2: return aom_highbd_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  } else {
    switch (plane) {
      case 0: return aom_get_y_sse(a, b);
      case 1: return aom_get_u_sse(a, b);
      case 2: return aom_get_v_sse(a, b);
      default: assert(plane >= 0 && plane <= 2); return 0;
    }
  }
#else
  (void)highbd;
  switch (plane) {
    case 0: return aom_get_y_sse(a, b);
    case 1: return aom_get_u_sse(a, b);
    case 2: return aom_get_v_sse(a, b);
    default: assert(plane >= 0 && plane <= 2); return 0;
  }
#endif
}